

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.cpp
# Opt level: O0

ostream * xe::ri::operator<<(ostream *str,NumericValue *value)

{
  Type TVar1;
  _Setprecision _Var2;
  ostream *this;
  deInt64 dVar3;
  double dVar4;
  NumericValue *value_local;
  ostream *str_local;
  
  TVar1 = NumericValue::getType(value);
  if (TVar1 == TYPE_INT64) {
    dVar3 = NumericValue::getInt64(value);
    str_local = (ostream *)std::ostream::operator<<(str,dVar3);
  }
  else {
    str_local = str;
    if (TVar1 == TYPE_FLOAT64) {
      _Var2 = std::setprecision(0x11);
      this = std::operator<<(str,_Var2);
      dVar4 = NumericValue::getFloat64(value);
      str_local = (ostream *)std::ostream::operator<<(this,dVar4);
    }
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const NumericValue& value)
{
	switch (value.getType())
	{
		case NumericValue::TYPE_FLOAT64:
			return str << std::setprecision(std::numeric_limits<double>::digits10 + 2) << value.getFloat64();

		case NumericValue::TYPE_INT64:
			return str << value.getInt64();

		default:
			DE_ASSERT(value.getType() == NumericValue::TYPE_EMPTY);
			return str;
	}
}